

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_source_seek_seconds
                    (ma_data_source *pDataSource,float secondCount,float *pSecondsSeeked)

{
  ma_result mVar1;
  ulong uVar2;
  ma_uint32 sampleRate;
  float local_24;
  ma_uint64 framesSeeked;
  
  framesSeeked = 0;
  if (pDataSource == (ma_data_source *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    local_24 = secondCount;
    mVar1 = ma_data_source_get_data_format
                      (pDataSource,(ma_format *)0x0,(ma_uint32 *)0x0,&sampleRate,(ma_channel *)0x0,0
                      );
    if (mVar1 == MA_SUCCESS) {
      uVar2 = (ulong)((float)sampleRate * local_24);
      mVar1 = ma_data_source_seek_pcm_frames
                        (pDataSource,
                         (long)((float)sampleRate * local_24 - 9.223372e+18) & (long)uVar2 >> 0x3f |
                         uVar2,&framesSeeked);
      *pSecondsSeeked = (float)(long)framesSeeked / (float)sampleRate;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_seek_seconds(ma_data_source* pDataSource, float secondCount, float* pSecondsSeeked)
{
    ma_uint64 frameCount;
    ma_uint64 framesSeeked = 0;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameCount = (ma_uint64)(secondCount * sampleRate);

    result = ma_data_source_seek_pcm_frames(pDataSource, frameCount, &framesSeeked);

    /* VC6 doesn't support division between unsigned 64-bit integer and floating point number. Signed integer needed. This shouldn't affect anything in practice */
    *pSecondsSeeked = (ma_int64)framesSeeked / (float)sampleRate;
    return result;
}